

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O2

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createUndefFunctionCall
          (PSNodesSeq *__return_storage_ptr__,LLVMPointerGraphBuilder *this,CallInst *CInst,
          Function *func)

{
  Value *val;
  Value *val_00;
  bool bVar1;
  AllocationFunction type;
  PSNode *n;
  PSNode **ppPVar2;
  initializer_list<dg::pta::PSNode_*> *l;
  CallInst *pCVar3;
  StringRef RHS;
  StringRef RHS_00;
  StringRef RHS_01;
  StringRef RHS_02;
  StringRef RHS_03;
  StringRef RHS_04;
  StringRef SVar4;
  undefined1 auVar5 [16];
  string local_70;
  PSNode *local_50;
  uint64_t lenVal;
  size_t local_40;
  PSNode *local_38;
  
  if (this[0x149] == (LLVMPointerGraphBuilder)0x1) {
    local_70._0_16_ = llvm::Value::getName();
    SVar4.Length = 4;
    SVar4.Data = "free";
    bVar1 = llvm::StringRef::equals((StringRef *)&local_70,SVar4);
    if (!bVar1) goto LAB_0012ffd0;
    lenVal = (uint64_t)createFree(this,(Instruction *)CInst);
    ppPVar2 = (PSNode **)&lenVal;
    l = (initializer_list<dg::pta::PSNode_*> *)&local_70;
LAB_0012ffb8:
    l->_M_array = ppPVar2;
    l->_M_len = 1;
    PSNodesSeq::PSNodesSeq(__return_storage_ptr__,l);
  }
  else {
LAB_0012ffd0:
    if (this[0x14a] == (LLVMPointerGraphBuilder)0x1) {
      SVar4 = (StringRef)llvm::Value::getName();
      RHS.Length = 0xe;
      RHS.Data = "pthread_create";
      local_70._0_16_ = SVar4;
      bVar1 = llvm::StringRef::equals((StringRef *)&local_70,RHS);
      if (bVar1) {
        createPthreadCreate(__return_storage_ptr__,this,CInst);
        return __return_storage_ptr__;
      }
      SVar4 = (StringRef)llvm::Value::getName();
      RHS_00.Length = 0xc;
      RHS_00.Data = "pthread_join";
      local_70._0_16_ = SVar4;
      bVar1 = llvm::StringRef::equals((StringRef *)&local_70,RHS_00);
      if (bVar1) {
        createPthreadJoin(__return_storage_ptr__,this,CInst);
        return __return_storage_ptr__;
      }
      SVar4 = (StringRef)llvm::Value::getName();
      RHS_01.Length = 0xc;
      RHS_01.Data = "pthread_exit";
      local_70._0_16_ = SVar4;
      bVar1 = llvm::StringRef::equals((StringRef *)&local_70,RHS_01);
      if (bVar1) {
        createPthreadExit(__return_storage_ptr__,this,CInst);
        return __return_storage_ptr__;
      }
    }
    auVar5 = llvm::Value::getName();
    local_40 = auVar5._8_8_;
    lenVal = auVar5._0_8_;
    llvm::StringRef::str_abi_cxx11_(&local_70,(StringRef *)&lenVal);
    type = AnalysisOptions::getAllocationFunction((AnalysisOptions *)(this + 0xf8),&local_70);
    std::__cxx11::string::_M_dispose();
    if (type != NONE) {
      createDynamicMemAlloc(__return_storage_ptr__,this,CInst,type);
      return __return_storage_ptr__;
    }
    if (((byte)func[0x21] & 0x20) != 0) {
      createIntrinsic(__return_storage_ptr__,this,(Instruction *)CInst);
      return __return_storage_ptr__;
    }
    SVar4 = (StringRef)llvm::Value::getName();
    RHS_02.Length = 6;
    RHS_02.Data = "memcpy";
    local_70._0_16_ = SVar4;
    bVar1 = llvm::StringRef::equals((StringRef *)&local_70,RHS_02);
    if (!bVar1) {
      RHS_03.Length = 0xc;
      RHS_03.Data = "__memcpy_chk";
      bVar1 = llvm::StringRef::equals((StringRef *)&local_70,RHS_03);
      if (!bVar1) {
        RHS_04.Length = 6;
        RHS_04.Data = "memove";
        bVar1 = llvm::StringRef::equals((StringRef *)&local_70,RHS_04);
        if (!bVar1) {
          local_50 = createUnknownCall(this);
          ppPVar2 = &local_50;
          l = (initializer_list<dg::pta::PSNode_*> *)&lenVal;
          goto LAB_0012ffb8;
        }
      }
    }
    pCVar3 = CInst + -(ulong)(uint)(*(int *)(CInst + 0x14) << 5);
    val = *(Value **)pCVar3;
    val_00 = *(Value **)(pCVar3 + 0x20);
    lenVal = llvmutils::getConstantValue(*(Value **)(pCVar3 + 0x40));
    local_50 = getOperand(this,val_00);
    local_38 = getOperand(this,val);
    n = PointerGraph::
        create<(dg::pta::PSNodeType)20,dg::pta::PSNode*,dg::pta::PSNode*,unsigned_long&>
                  ((PointerGraph *)this,&local_50,&local_38,&lenVal);
    PSNodesSeq::PSNodesSeq(__return_storage_ptr__,n);
  }
  return __return_storage_ptr__;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createUndefFunctionCall(const llvm::CallInst *CInst,
                                                 const llvm::Function *func) {
    assert(func->empty());
    // is it a call to free? If so, create invalidate node instead.
    if (invalidate_nodes && func->getName().equals("free")) {
        return {createFree(CInst)};
    }
    if (threads_) {
        if (func->getName().equals("pthread_create")) {
            return createPthreadCreate(CInst);
        }
        if (func->getName().equals("pthread_join")) {
            return createPthreadJoin(CInst);
        }
        if (func->getName().equals("pthread_exit")) {
            return createPthreadExit(CInst);
        }
    }
    /// memory allocation (malloc, calloc, etc.)
    auto type = _options.getAllocationFunction(func->getName().str());
    if (type != AllocationFunction::NONE) {
        return createDynamicMemAlloc(CInst, type);
    }
    if (func->isIntrinsic()) {
        return createIntrinsic(CInst);
    }

    // mempy/memmove
    const auto &funname = func->getName();
    if (funname.equals("memcpy") || funname.equals("__memcpy_chk") ||
        funname.equals("memove")) {
        auto *dest = CInst->getOperand(0);
        auto *src = CInst->getOperand(1);
        auto lenVal = llvmutils::getConstantValue(CInst->getOperand(2));
        return PS.create<PSNodeType::MEMCPY>(getOperand(src), getOperand(dest),
                                             lenVal);
    }

    return {createUnknownCall()};
}